

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraSublimeTextGenerator.cxx
# Opt level: O0

string * __thiscall
cmExtraSublimeTextGenerator::ComputeFlagsForObject_abi_cxx11_
          (string *__return_storage_ptr__,cmExtraSublimeTextGenerator *this,cmSourceFile *source,
          cmLocalGenerator *lg,cmGeneratorTarget *gtgt)

{
  bool bVar1;
  string *psVar2;
  ulong uVar3;
  cmMakefile *this_00;
  string local_200;
  cmValue local_1e0;
  cmValue coptions;
  undefined1 local_1d0 [8];
  string COMPILE_OPTIONS;
  cmValue local_190;
  cmValue cflags;
  undefined1 local_180 [8];
  string COMPILE_FLAGS;
  string local_140;
  undefined1 local_120 [8];
  cmGeneratorExpressionInterpreter genexInterpreter;
  allocator<char> local_91;
  string local_90;
  string *local_70;
  string *config;
  undefined1 local_58 [8];
  string language;
  cmGeneratorTarget *gtgt_local;
  cmLocalGenerator *lg_local;
  cmSourceFile *source_local;
  cmExtraSublimeTextGenerator *this_local;
  string *flags;
  
  language.field_2._M_local_buf[0xf] = '\0';
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  psVar2 = cmSourceFile::GetOrDetermineLanguage_abi_cxx11_(source);
  std::__cxx11::string::string((string *)local_58,(string *)psVar2);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) != 0) {
    std::__cxx11::string::operator=((string *)local_58,"C");
  }
  cmGeneratorTarget::AddExplicitLanguageFlags(gtgt,__return_storage_ptr__,source);
  this_00 = cmLocalGenerator::GetMakefile(lg);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,"CMAKE_BUILD_TYPE",&local_91);
  psVar2 = cmMakefile::GetSafeDefinition(this_00,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator(&local_91);
  local_70 = psVar2;
  cmLocalGenerator::GetTargetCompileFlags
            ((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)((long)&genexInterpreter.Language.field_2 + 8),lg,gtgt,psVar2,(string *)local_58,
             __return_storage_ptr__);
  std::
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)((long)&genexInterpreter.Language.field_2 + 8));
  std::__cxx11::string::string((string *)&local_140,(string *)local_70);
  std::__cxx11::string::string
            ((string *)(COMPILE_FLAGS.field_2._M_local_buf + 8),(string *)local_58);
  cmGeneratorExpressionInterpreter::cmGeneratorExpressionInterpreter
            ((cmGeneratorExpressionInterpreter *)local_120,lg,&local_140,gtgt,
             (string *)((long)&COMPILE_FLAGS.field_2 + 8));
  std::__cxx11::string::~string((string *)(COMPILE_FLAGS.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)&local_140);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_180,"COMPILE_FLAGS",(allocator<char> *)((long)&cflags.Value + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&cflags.Value + 7));
  local_190 = cmSourceFile::GetProperty(source,(string *)local_180);
  bVar1 = cmValue::operator_cast_to_bool(&local_190);
  if (bVar1) {
    psVar2 = cmValue::operator*[abi_cxx11_(&local_190);
    std::__cxx11::string::string
              ((string *)(COMPILE_OPTIONS.field_2._M_local_buf + 8),(string *)psVar2);
    psVar2 = cmGeneratorExpressionInterpreter::Evaluate
                       ((cmGeneratorExpressionInterpreter *)local_120,
                        (string *)((long)&COMPILE_OPTIONS.field_2 + 8),(string *)local_180);
    (*(lg->super_cmOutputConverter)._vptr_cmOutputConverter[7])(lg,__return_storage_ptr__,psVar2);
    std::__cxx11::string::~string((string *)(COMPILE_OPTIONS.field_2._M_local_buf + 8));
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1d0,"COMPILE_OPTIONS",(allocator<char> *)((long)&coptions.Value + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&coptions.Value + 7));
  local_1e0 = cmSourceFile::GetProperty(source,(string *)local_1d0);
  bVar1 = cmValue::operator_cast_to_bool(&local_1e0);
  if (bVar1) {
    psVar2 = cmValue::operator*[abi_cxx11_(&local_1e0);
    std::__cxx11::string::string((string *)&local_200,(string *)psVar2);
    psVar2 = cmGeneratorExpressionInterpreter::Evaluate
                       ((cmGeneratorExpressionInterpreter *)local_120,&local_200,(string *)local_1d0
                       );
    cmLocalGenerator::AppendCompileOptions(lg,__return_storage_ptr__,psVar2,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_200);
  }
  language.field_2._M_local_buf[0xf] = '\x01';
  std::__cxx11::string::~string((string *)local_1d0);
  std::__cxx11::string::~string((string *)local_180);
  cmGeneratorExpressionInterpreter::~cmGeneratorExpressionInterpreter
            ((cmGeneratorExpressionInterpreter *)local_120);
  std::__cxx11::string::~string((string *)local_58);
  if ((language.field_2._M_local_buf[0xf] & 1U) == 0) {
    std::__cxx11::string::~string((string *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmExtraSublimeTextGenerator::ComputeFlagsForObject(
  cmSourceFile* source, cmLocalGenerator* lg, cmGeneratorTarget* gtgt)
{
  std::string flags;
  std::string language = source->GetOrDetermineLanguage();
  if (language.empty()) {
    language = "C";
  }

  // Explicitly add the explicit language flag before any other flag
  // so user flags can override it.
  gtgt->AddExplicitLanguageFlags(flags, *source);

  std::string const& config =
    lg->GetMakefile()->GetSafeDefinition("CMAKE_BUILD_TYPE");

  lg->GetTargetCompileFlags(gtgt, config, language, flags);

  // Add source file specific flags.
  cmGeneratorExpressionInterpreter genexInterpreter(lg, config, gtgt,
                                                    language);

  const std::string COMPILE_FLAGS("COMPILE_FLAGS");
  if (cmValue cflags = source->GetProperty(COMPILE_FLAGS)) {
    lg->AppendFlags(flags, genexInterpreter.Evaluate(*cflags, COMPILE_FLAGS));
  }

  const std::string COMPILE_OPTIONS("COMPILE_OPTIONS");
  if (cmValue coptions = source->GetProperty(COMPILE_OPTIONS)) {
    lg->AppendCompileOptions(
      flags, genexInterpreter.Evaluate(*coptions, COMPILE_OPTIONS));
  }

  return flags;
}